

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  pointer ppVar4;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  Extension *local_88;
  Extension *extension;
  byte local_69;
  LogMessage local_68;
  _Self local_30;
  _Self local_28;
  iterator iter;
  int index2_local;
  int index1_local;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node._4_4_ = index2;
  index2_local = number;
  _index1_local = this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,&index2_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar1 = std::operator!=(&local_28,&local_30);
  local_69 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x27b);
    local_69 = 1;
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)((long)&extension + 3),pLVar3);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_28);
  local_88 = &ppVar4->second;
  local_c1 = 0;
  if (((ppVar4->second).is_repeated & 1U) == 0) {
    LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x27e);
    local_c1 = 1;
    pLVar3 = LogMessage::operator<<(&local_c0,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_c2,pLVar3);
  }
  if ((local_c1 & 1) != 0) {
    LogMessage::~LogMessage(&local_c0);
  }
  CVar2 = anon_unknown_0::cpp_type(local_88->type);
  switch(CVar2) {
  case CPPTYPE_INT32:
    RepeatedField<int>::SwapElements
              ((local_88->field_0).repeated_int32_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::SwapElements
              ((local_88->field_0).repeated_int64_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::SwapElements
              ((local_88->field_0).repeated_uint32_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::SwapElements
              ((local_88->field_0).repeated_uint64_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::SwapElements
              ((local_88->field_0).repeated_double_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::SwapElements
              ((local_88->field_0).repeated_float_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::SwapElements
              ((local_88->field_0).repeated_bool_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_ENUM:
    RepeatedField<int>::SwapElements
              ((local_88->field_0).repeated_int32_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_STRING:
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::SwapElements((local_88->field_0).repeated_string_value,index1,iter._M_node._4_4_);
    break;
  case CPPTYPE_MESSAGE:
    RepeatedPtrField<google::protobuf::MessageLite>::SwapElements
              ((local_88->field_0).repeated_message_value,index1,iter._M_node._4_4_);
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}